

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O2

void cjson_replace_item_in_object_should_preserve_name(void)

{
  cJSON *item;
  cJSON *newitem;
  long in_FS_OFFSET;
  cJSON root [1];
  cJSON local_68;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.valuedouble = 0.0;
  local_68.string = (char *)0x0;
  local_68.valuestring = (char *)0x0;
  local_68.valueint = 0;
  local_68._44_4_ = 0;
  local_68.child = (cJSON *)0x0;
  local_68.type = 0;
  local_68._28_4_ = 0;
  local_68.next = (cJSON *)0x0;
  local_68.prev = (cJSON *)0x0;
  item = cJSON_CreateNumber(1.0);
  if (item == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x150);
  }
  newitem = cJSON_CreateNumber(2.0);
  if (newitem == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x152);
  }
  cJSON_AddItemToObject(&local_68,"child",item);
  cJSON_ReplaceItemInObject(&local_68,"child",newitem);
  if (local_68.child != newitem) {
    UnityFail(" Expected TRUE Was FALSE",0x157);
  }
  UnityAssertEqualString("child",newitem->string,(char *)0x0,0x158);
  cJSON_Delete(newitem);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void cjson_replace_item_in_object_should_preserve_name(void)
{
    cJSON root[1] = {{ NULL, NULL, NULL, 0, NULL, 0, 0, NULL }};
    cJSON *child = NULL;
    cJSON *replacement = NULL;

    child = cJSON_CreateNumber(1);
    TEST_ASSERT_NOT_NULL(child);
    replacement = cJSON_CreateNumber(2);
    TEST_ASSERT_NOT_NULL(replacement);

    cJSON_AddItemToObject(root, "child", child);
    cJSON_ReplaceItemInObject(root, "child", replacement);

    TEST_ASSERT_TRUE(root->child == replacement);
    TEST_ASSERT_EQUAL_STRING("child", replacement->string);

    cJSON_Delete(replacement);
}